

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::colSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 *in_RDI;
  int *sing;
  int *rperm;
  int *rorig;
  int *idx;
  int newrow;
  int p_row;
  int p_col;
  int len;
  int n;
  int k;
  int j;
  int i;
  Rational *in_stack_000000d8;
  int in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  CLUFactorRational *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff88;
  int iVar14;
  int local_24;
  int local_20;
  int local_1c;
  
  lVar6 = *(long *)(in_RDI + 0x2a);
  lVar7 = *(long *)(in_RDI + 0x2c);
  lVar8 = *(long *)(in_RDI + 0x90);
  local_1c = 0;
  do {
    if ((int)in_RDI[0x9a] <= local_1c) {
      return;
    }
    iVar1 = *(int *)(lVar6 + (long)local_1c * 4);
    lVar9 = *(long *)(in_RDI + 0x68);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x6a) + (long)iVar1 * 4);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x6c) + (long)iVar1 * 4);
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      iVar4 = *(int *)(lVar9 + (long)iVar2 * 4 + (long)local_20 * 4);
      iVar11 = (*(int *)(*(long *)(in_RDI + 0x82) + (long)iVar4 * 4) +
               *(int *)(*(long *)(in_RDI + 0x84) + (long)iVar4 * 4)) -
               *(int *)(*(long *)(in_RDI + 0x98) + (long)iVar4 * 4);
      local_24 = iVar11;
      while (*(int *)(*(long *)(in_RDI + 0x7a) + (long)local_24 * 4) != iVar1) {
        local_24 = local_24 + 1;
      }
      *(undefined4 *)(*(long *)(in_RDI + 0x7a) + (long)local_24 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x7a) + (long)iVar11 * 4);
      *(int *)(*(long *)(in_RDI + 0x7a) + (long)iVar11 * 4) = iVar1;
      iVar11 = *(int *)(*(long *)(in_RDI + 0x98) + (long)iVar4 * 4) + -1;
      *(int *)(*(long *)(in_RDI + 0x98) + (long)iVar4 * 4) = iVar11;
      if (iVar11 == 1) {
        lVar10 = *(long *)(in_RDI + 0x7a);
        iVar11 = *(int *)(*(long *)(in_RDI + 0x84) + (long)iVar4 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0x84) + (long)iVar4 * 4) = iVar11;
        iVar11 = *(int *)(lVar10 + (long)(iVar11 + *(int *)(*(long *)(in_RDI + 0x82) +
                                                           (long)iVar4 * 4)) * 4);
        if (-1 < *(int *)(lVar7 + (long)iVar11 * 4)) {
          *in_RDI = 2;
          return;
        }
        iVar12 = *(int *)(*(long *)(in_RDI + 0x6a) + (long)iVar11 * 4);
        iVar13 = *(int *)(*(long *)(in_RDI + 0x6c) + (long)iVar11 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0x6c) + (long)iVar11 * 4) = iVar13;
        iVar12 = iVar12 + iVar13;
        local_24 = iVar12;
        while (*(int *)(*(long *)(in_RDI + 0x68) + (long)local_24 * 4) != iVar4) {
          local_24 = local_24 + -1;
        }
        iVar13 = in_RDI[0x9a];
        iVar14 = iVar4;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(iVar11,iVar4),iVar13);
        setPivot(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e4,
                 in_stack_000000d8);
        iVar5 = in_RDI[0x9a];
        in_RDI[0x9a] = iVar5 + 1;
        *(int *)(lVar8 + (long)iVar5 * 4) = iVar4;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(iVar11,iVar14),iVar13);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(iVar11,iVar14),iVar13);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT44(iVar11,iVar14),
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT44(iVar13,in_stack_ffffffffffffff88));
        *(undefined4 *)(*(long *)(in_RDI + 0x68) + (long)local_24 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0x68) + (long)iVar12 * 4);
      }
      else if (iVar11 == 0) {
        *in_RDI = 2;
        return;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

inline void CLUFactorRational::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               stat = SLinSolverRational::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}